

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCallback.cc
# Opt level: O0

int __thiscall flow::NativeCallback::findParamByName(NativeCallback *this,string *name)

{
  __type_conflict2 _Var1;
  size_type sVar2;
  const_reference __lhs;
  int local_24;
  int e;
  int i;
  string *name_local;
  NativeCallback *this_local;
  
  local_24 = 0;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->names_);
  while( true ) {
    if (local_24 == (int)sVar2) {
      return -1;
    }
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->names_,(long)local_24);
    _Var1 = std::operator==(__lhs,name);
    if (_Var1) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int NativeCallback::findParamByName(const std::string& name) const {
  for (int i = 0, e = names_.size(); i != e; ++i)
    if (names_[i] == name)
      return i;

  return -1;
}